

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O1

void __thiscall btGearConstraint::getInfo2(btGearConstraint *this,btConstraintInfo2 *info)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  btRigidBody *pbVar19;
  btRigidBody *pbVar20;
  btScalar *pbVar21;
  
  fVar1 = (this->m_axisInA).m_floats[0];
  fVar2 = (this->m_axisInA).m_floats[1];
  fVar3 = (this->m_axisInA).m_floats[2];
  pbVar19 = (this->super_btTypedConstraint).m_rbA;
  pbVar20 = (this->super_btTypedConstraint).m_rbB;
  fVar4 = (pbVar19->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
  fVar5 = (pbVar19->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
  fVar6 = (pbVar19->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
  fVar7 = (this->m_axisInB).m_floats[0];
  fVar8 = (this->m_axisInB).m_floats[1];
  fVar9 = (pbVar20->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
  fVar10 = (pbVar20->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
  fVar11 = (this->m_axisInB).m_floats[2];
  fVar12 = (pbVar20->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
  fVar13 = (pbVar20->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
  fVar14 = (pbVar20->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
  fVar15 = (pbVar20->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
  fVar16 = (pbVar20->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
  fVar17 = (pbVar20->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
  fVar18 = (pbVar20->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
  pbVar21 = info->m_J1angularAxis;
  *(ulong *)pbVar21 =
       CONCAT44(fVar3 * (pbVar19->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                        [2] +
                fVar1 * (pbVar19->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                        [0] +
                (pbVar19->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1] *
                fVar2,fVar3 * (pbVar19->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].
                              m_floats[2] +
                      fVar1 * (pbVar19->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].
                              m_floats[0] +
                      (pbVar19->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                      [1] * fVar2);
  pbVar21[2] = fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2;
  pbVar21 = info->m_J2angularAxis;
  *pbVar21 = (fVar12 * fVar11 + fVar10 * fVar7 + fVar9 * fVar8) * this->m_ratio;
  pbVar21[1] = (fVar15 * fVar11 + fVar14 * fVar7 + fVar13 * fVar8) * this->m_ratio;
  pbVar21[2] = (fVar11 * fVar18 + fVar7 * fVar17 + fVar8 * fVar16) * this->m_ratio;
  return;
}

Assistant:

SIMD_FORCE_INLINE btScalar dot(const btVector3& v) const
	{
#if defined BT_USE_SIMD_VECTOR3 && defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
		__m128 vd = _mm_mul_ps(mVec128, v.mVec128);
		__m128 z = _mm_movehl_ps(vd, vd);
		__m128 y = _mm_shuffle_ps(vd, vd, 0x55);
		vd = _mm_add_ss(vd, y);
		vd = _mm_add_ss(vd, z);
		return _mm_cvtss_f32(vd);
#elif defined(BT_USE_NEON)
		float32x4_t vd = vmulq_f32(mVec128, v.mVec128);
		float32x2_t x = vpadd_f32(vget_low_f32(vd), vget_low_f32(vd));
		x = vadd_f32(x, vget_high_f32(vd));
		return vget_lane_f32(x, 0);
#else
		return	m_floats[0] * v.m_floats[0] +
				m_floats[1] * v.m_floats[1] +
				m_floats[2] * v.m_floats[2];
#endif
	}